

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

bool __thiscall crnlib::dxt_image::flip_x(dxt_image *this)

{
  uint8 uVar1;
  uint8 uVar2;
  element_type eVar3;
  char cVar4;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [14];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [13];
  undefined1 auVar31 [14];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  uint6 uVar34;
  uint uVar35;
  uint value;
  uint value_00;
  ulong uVar36;
  uint bit_ofs;
  uint uVar37;
  bool bVar38;
  uint uVar39;
  byte bVar40;
  int iVar41;
  byte bVar42;
  int iVar43;
  dxt_image *pdVar44;
  int iVar45;
  ulong uVar46;
  uint y;
  uint y_00;
  short sVar47;
  uint uVar56;
  uint uVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [12];
  ushort uVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  element tmp;
  dxt3_block local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  dxt_image *local_60;
  uint local_58;
  uint local_54;
  int local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined4 uVar48;
  undefined6 uVar49;
  undefined8 uVar50;
  undefined1 auVar51 [12];
  undefined1 auVar52 [14];
  undefined1 auVar55 [16];
  undefined1 auVar59 [14];
  undefined1 auVar62 [16];
  
  if (((uint)(this->m_format + ~cDXN_YX) < 5) ||
     (uVar37 = this->m_width, 4 < uVar37 && (uVar37 & 3) != 0)) {
    bVar38 = false;
  }
  else {
    bVar38 = true;
    if (uVar37 != 1) {
      local_60 = this;
      local_68 = this->m_blocks_x >> 1;
      if (1 < this->m_blocks_x) {
        uVar39 = 0;
        do {
          flip_col(local_60,uVar39);
          uVar39 = uVar39 + 1;
        } while (local_68 != uVar39);
      }
      if ((local_60->m_blocks_x & 1) != 0) {
        local_6c = local_60->m_width;
        local_38 = 4;
        if (local_6c < 4) {
          local_38 = (ulong)local_6c;
        }
        if (local_60->m_blocks_y != 0) {
          local_64 = (uint)(local_38 >> 1);
          uVar37 = (uint)local_38;
          local_50 = uVar37 * 3 + -3;
          local_54 = uVar37 & 0xfffffffe;
          local_58 = uVar37 * 2 - 2;
          local_48 = 0;
          pdVar44 = local_60;
          auVar67 = _DAT_001bae90;
          auVar68 = _DAT_001b4750;
          uVar39 = local_68;
          do {
            uVar36 = (ulong)pdVar44->m_num_elements_per_block;
            if (pdVar44->m_num_elements_per_block != 0) {
              local_40 = 0;
              do {
                local_78.m_alpha =
                     *&pdVar44->m_pElements
                       [(int)local_40 + (pdVar44->m_blocks_x * (int)local_48 + uVar39) * (int)uVar36
                       ].m_bytes;
                eVar3 = pdVar44->m_element_type[local_40];
                if (eVar3 == cAlphaDXT5) {
                  if (1 < local_6c) {
                    iVar41 = 0;
                    uVar37 = 0;
                    iVar43 = local_50;
                    do {
                      local_4c = uVar37;
                      iVar45 = 0;
                      do {
                        uVar46 = (ulong)((uint)(iVar41 + iVar45) >> 3);
                        uVar1 = local_78.m_alpha[uVar46 + 2];
                        uVar2 = local_78.m_alpha[uVar46 + 3];
                        bVar40 = (byte)(iVar41 + iVar45) & 7;
                        uVar37 = iVar43 + iVar45;
                        uVar36 = (ulong)(uVar37 >> 3);
                        uVar35 = (uint)local_78.m_alpha[uVar36 + 2];
                        if (uVar37 < 0x28) {
                          uVar35 = (uint)CONCAT11(local_78.m_alpha[uVar36 + 3],
                                                  local_78.m_alpha[uVar36 + 2]);
                        }
                        bVar42 = (byte)uVar37 & 7;
                        *(ushort *)(local_78.m_alpha + uVar46 + 2) =
                             (ushort)((uVar35 >> bVar42 & 7) << bVar40) |
                             ~(ushort)(7 << bVar40) & CONCAT11(local_78.m_alpha[uVar46 + 3],uVar1);
                        uVar35 = (uint)local_78.m_alpha[uVar36 + 2];
                        if (uVar37 < 0x28) {
                          uVar35 = (uint)CONCAT11(local_78.m_alpha[uVar36 + 3],
                                                  local_78.m_alpha[uVar36 + 2]);
                        }
                        uVar35 = ((ushort)(CONCAT11(uVar2,uVar1) >> bVar40) & 7) << bVar42 |
                                 ~(7 << bVar42) & uVar35;
                        local_78.m_alpha[uVar36 + 2] = (uint8)uVar35;
                        if (uVar37 < 0x28) {
                          local_78.m_alpha[uVar36 + 3] = (uint8)(uVar35 >> 8);
                        }
                        iVar45 = iVar45 + 0xc;
                      } while (iVar45 != 0x30);
                      uVar37 = local_4c + 1;
                      iVar43 = iVar43 + -3;
                      iVar41 = iVar41 + 3;
                    } while (uVar37 != local_64);
                  }
                }
                else if (eVar3 == cAlphaDXT3) {
                  if (1 < local_6c) {
                    uVar37 = 0;
                    do {
                      uVar39 = ~uVar37 + (int)local_38;
                      y_00 = 0;
                      do {
                        value = dxt3_block::get_alpha(&local_78,uVar37,y_00,false);
                        value_00 = dxt3_block::get_alpha(&local_78,uVar39,y_00,false);
                        dxt3_block::set_alpha(&local_78,uVar37,y_00,value_00,false);
                        dxt3_block::set_alpha(&local_78,uVar39,y_00,value,false);
                        y_00 = y_00 + 1;
                      } while (y_00 != 4);
                      uVar37 = uVar37 + 1;
                      auVar67 = _DAT_001bae90;
                      auVar68 = _DAT_001b4750;
                    } while (uVar37 != local_64);
                  }
                }
                else if ((eVar3 == cColorDXT1) && (1 < local_6c)) {
                  uVar35 = 0;
                  auVar53 = ZEXT416((uint)local_78.m_alpha._4_4_);
                  uVar37 = local_58;
                  do {
                    bVar40 = ~(byte)(3 << ((byte)uVar37 & 0x1f));
                    bVar42 = ~(byte)(3 << ((byte)uVar35 & 0x1f));
                    auVar65 = pshuflw(in_XMM2,ZEXT216(CONCAT11(bVar42,bVar42)),0);
                    auVar20[0xd] = 0;
                    auVar20._0_13_ = auVar53._0_13_;
                    auVar20[0xe] = auVar53[7];
                    auVar22[0xc] = auVar53[6];
                    auVar22._0_12_ = auVar53._0_12_;
                    auVar22._13_2_ = auVar20._13_2_;
                    auVar23[0xb] = 0;
                    auVar23._0_11_ = auVar53._0_11_;
                    auVar23._12_3_ = auVar22._12_3_;
                    auVar24[10] = auVar53[5];
                    auVar24._0_10_ = auVar53._0_10_;
                    auVar24._11_4_ = auVar23._11_4_;
                    auVar25[9] = 0;
                    auVar25._0_9_ = auVar53._0_9_;
                    auVar25._10_5_ = auVar24._10_5_;
                    auVar26[8] = auVar53[4];
                    auVar26._0_8_ = auVar53._0_8_;
                    auVar26._9_6_ = auVar25._9_6_;
                    auVar27._7_8_ = 0;
                    auVar27._0_7_ = auVar26._8_7_;
                    Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),auVar53[3]);
                    auVar32._9_6_ = 0;
                    auVar32._0_9_ = Var28;
                    auVar29._1_10_ = SUB1510(auVar32 << 0x30,5);
                    auVar29[0] = auVar53[2];
                    auVar33._11_4_ = 0;
                    auVar33._0_11_ = auVar29;
                    auVar30._1_12_ = SUB1512(auVar33 << 0x20,3);
                    auVar30[0] = auVar53[1];
                    uVar64 = (ushort)Var28;
                    auVar21._10_2_ = 0;
                    auVar21._0_10_ = auVar30._0_10_ << 0x10;
                    auVar21._12_2_ = uVar64;
                    uVar34 = CONCAT42(auVar21._10_4_,auVar29._0_2_);
                    auVar31._6_8_ = 0;
                    auVar31._0_6_ = uVar34;
                    in_XMM2 = auVar65 & auVar53;
                    uVar36 = (ulong)uVar35;
                    auVar65._1_3_ = 0;
                    auVar65[0] = auVar53[0] >> uVar36;
                    uVar56 = (uint)CONCAT82(SUB148(auVar31 << 0x40,6),auVar30._0_2_);
                    auVar65._4_4_ = uVar56 >> uVar36;
                    uVar57 = (uint)uVar34;
                    auVar65._8_4_ = uVar57 >> uVar36;
                    auVar65._12_2_ = uVar64 >> uVar36;
                    auVar65._14_2_ = 0;
                    auVar54 = ZEXT216(CONCAT11(bVar40,bVar40));
                    uVar36 = (ulong)uVar37;
                    auVar60._1_3_ = 0;
                    auVar60[0] = auVar53[0] >> uVar36;
                    auVar60._4_4_ = uVar56 >> uVar36;
                    auVar60._8_4_ = uVar57 >> uVar36;
                    auVar60._12_2_ = uVar64 >> uVar36;
                    auVar60._14_2_ = 0;
                    auVar66 = pshuflw(auVar54,auVar54,0);
                    auVar60 = auVar60 & auVar67;
                    auVar61._0_4_ = auVar60._0_4_ << uVar35;
                    auVar61._4_4_ = auVar60._4_4_;
                    auVar61._8_4_ = auVar60._8_4_;
                    auVar61._12_4_ = auVar60._12_4_;
                    auVar65 = auVar65 & auVar67;
                    auVar61 = auVar61 & auVar68;
                    sVar12 = auVar61._0_2_;
                    cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar61[0] - (0xff < sVar12);
                    sVar13 = auVar61._2_2_;
                    sVar47 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar61[2] - (0xff < sVar13)
                                      ,cVar4);
                    sVar14 = auVar61._4_2_;
                    cVar5 = (0 < sVar14) * (sVar14 < 0x100) * auVar61[4] - (0xff < sVar14);
                    sVar15 = auVar61._6_2_;
                    uVar48 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar61[6] - (0xff < sVar15)
                                      ,CONCAT12(cVar5,sVar47));
                    sVar16 = auVar61._8_2_;
                    cVar6 = (0 < sVar16) * (sVar16 < 0x100) * auVar61[8] - (0xff < sVar16);
                    sVar17 = auVar61._10_2_;
                    uVar49 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar61[10] -
                                      (0xff < sVar17),CONCAT14(cVar6,uVar48));
                    sVar18 = auVar61._12_2_;
                    cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar61[0xc] - (0xff < sVar18);
                    sVar19 = auVar61._14_2_;
                    uVar50 = CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar61[0xe] -
                                      (0xff < sVar19),CONCAT16(cVar7,uVar49));
                    cVar8 = (0 < sVar12) * (sVar12 < 0x100) * auVar61[0] - (0xff < sVar12);
                    auVar58._0_10_ =
                         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar61[2] - (0xff < sVar13),
                                  CONCAT18(cVar8,uVar50));
                    cVar9 = (0 < sVar14) * (sVar14 < 0x100) * auVar61[4] - (0xff < sVar14);
                    auVar58[10] = cVar9;
                    auVar58[0xb] = (0 < sVar15) * (sVar15 < 0x100) * auVar61[6] - (0xff < sVar15);
                    cVar10 = (0 < sVar16) * (sVar16 < 0x100) * auVar61[8] - (0xff < sVar16);
                    auVar59[0xc] = cVar10;
                    auVar59._0_12_ = auVar58;
                    auVar59[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar61[10] - (0xff < sVar17);
                    cVar11 = (0 < sVar18) * (sVar18 < 0x100) * auVar61[0xc] - (0xff < sVar18);
                    auVar62[0xe] = cVar11;
                    auVar62._0_14_ = auVar59;
                    auVar62[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar61[0xe] - (0xff < sVar19);
                    sVar12 = (short)((uint)uVar48 >> 0x10);
                    auVar63[1] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                    auVar63[0] = (0 < sVar47) * (sVar47 < 0x100) * cVar4 - (0xff < sVar47);
                    sVar13 = (short)((uint6)uVar49 >> 0x20);
                    auVar63[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                    sVar14 = (short)((ulong)uVar50 >> 0x30);
                    auVar63[3] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                    sVar15 = (short)((unkuint10)auVar58._0_10_ >> 0x40);
                    auVar63[4] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                    sVar16 = auVar58._10_2_;
                    auVar63[5] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                    sVar17 = auVar59._12_2_;
                    auVar63[6] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                    sVar18 = auVar62._14_2_;
                    auVar63[7] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
                    auVar63[8] = (0 < sVar47) * (sVar47 < 0x100) * cVar4 - (0xff < sVar47);
                    auVar63[9] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                    auVar63[10] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                    auVar63[0xb] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                    auVar63[0xc] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                    auVar63[0xd] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                    auVar63[0xe] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                    auVar63[0xf] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
                    auVar54._0_4_ = auVar65._0_4_ << uVar37;
                    auVar54._4_4_ = auVar65._4_4_;
                    auVar54._8_4_ = auVar65._8_4_;
                    auVar54._12_4_ = auVar65._12_4_;
                    auVar54 = auVar54 & auVar68;
                    sVar12 = auVar54._0_2_;
                    cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar54[0] - (0xff < sVar12);
                    sVar13 = auVar54._2_2_;
                    sVar47 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar54[2] - (0xff < sVar13)
                                      ,cVar4);
                    sVar14 = auVar54._4_2_;
                    cVar5 = (0 < sVar14) * (sVar14 < 0x100) * auVar54[4] - (0xff < sVar14);
                    sVar15 = auVar54._6_2_;
                    uVar48 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar54[6] - (0xff < sVar15)
                                      ,CONCAT12(cVar5,sVar47));
                    sVar16 = auVar54._8_2_;
                    cVar6 = (0 < sVar16) * (sVar16 < 0x100) * auVar54[8] - (0xff < sVar16);
                    sVar17 = auVar54._10_2_;
                    uVar49 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar54[10] -
                                      (0xff < sVar17),CONCAT14(cVar6,uVar48));
                    sVar18 = auVar54._12_2_;
                    cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar54[0xc] - (0xff < sVar18);
                    sVar19 = auVar54._14_2_;
                    uVar50 = CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar54[0xe] -
                                      (0xff < sVar19),CONCAT16(cVar7,uVar49));
                    cVar8 = (0 < sVar12) * (sVar12 < 0x100) * auVar54[0] - (0xff < sVar12);
                    auVar51._0_10_ =
                         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar54[2] - (0xff < sVar13),
                                  CONCAT18(cVar8,uVar50));
                    cVar9 = (0 < sVar14) * (sVar14 < 0x100) * auVar54[4] - (0xff < sVar14);
                    auVar51[10] = cVar9;
                    auVar51[0xb] = (0 < sVar15) * (sVar15 < 0x100) * auVar54[6] - (0xff < sVar15);
                    cVar10 = (0 < sVar16) * (sVar16 < 0x100) * auVar54[8] - (0xff < sVar16);
                    auVar52[0xc] = cVar10;
                    auVar52._0_12_ = auVar51;
                    auVar52[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar54[10] - (0xff < sVar17);
                    cVar11 = (0 < sVar18) * (sVar18 < 0x100) * auVar54[0xc] - (0xff < sVar18);
                    auVar55[0xe] = cVar11;
                    auVar55._0_14_ = auVar52;
                    auVar55[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar54[0xe] - (0xff < sVar19);
                    sVar12 = (short)((uint)uVar48 >> 0x10);
                    auVar53[1] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                    auVar53[0] = (0 < sVar47) * (sVar47 < 0x100) * cVar4 - (0xff < sVar47);
                    sVar13 = (short)((uint6)uVar49 >> 0x20);
                    auVar53[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                    sVar14 = (short)((ulong)uVar50 >> 0x30);
                    auVar53[3] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                    sVar15 = (short)((unkuint10)auVar51._0_10_ >> 0x40);
                    auVar53[4] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                    sVar16 = auVar51._10_2_;
                    auVar53[5] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                    sVar17 = auVar52._12_2_;
                    auVar53[6] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                    sVar18 = auVar55._14_2_;
                    auVar53[7] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
                    auVar53[8] = (0 < sVar47) * (sVar47 < 0x100) * cVar4 - (0xff < sVar47);
                    auVar53[9] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                    auVar53[10] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                    auVar53[0xb] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                    auVar53[0xc] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                    auVar53[0xd] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                    auVar53[0xe] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                    auVar53[0xf] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
                    auVar53 = auVar53 | (auVar63 | in_XMM2) & auVar66;
                    uVar35 = uVar35 + 2;
                    uVar37 = uVar37 - 2;
                  } while (local_54 != uVar35);
                  uVar48 = auVar53._0_4_;
                  local_78.m_alpha[4] = (char)uVar48;
                  local_78.m_alpha[5] = (char)((uint)uVar48 >> 8);
                  local_78.m_alpha[6] = (char)((uint)uVar48 >> 0x10);
                  local_78.m_alpha[7] = (char)((uint)uVar48 >> 0x18);
                }
                *&local_60->m_pElements
                  [(local_60->m_blocks_x * (int)local_48 + local_68) *
                   local_60->m_num_elements_per_block + (int)local_40].m_bytes = local_78.m_alpha;
                local_40 = local_40 + 1;
                uVar36 = (ulong)local_60->m_num_elements_per_block;
                pdVar44 = local_60;
                uVar39 = local_68;
              } while (local_40 < uVar36);
            }
            uVar37 = (int)local_48 + 1;
            local_48 = (ulong)uVar37;
          } while (uVar37 < pdVar44->m_blocks_y);
          bVar38 = true;
        }
      }
    }
  }
  return bVar38;
}

Assistant:

bool dxt_image::flip_x() {
  if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS) {
    // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
    return false;
  }

  if ((m_width & 3) && (m_width > 4))
    return false;

  if (m_width == 1)
    return true;

  const uint mid_x = m_blocks_x / 2;

  for (uint x = 0; x < mid_x; x++)
    flip_col(x);

  if (m_blocks_x & 1) {
    const uint w = math::minimum(m_width, 4U);
    for (uint y = 0; y < m_blocks_y; y++) {
      for (uint e = 0; e < get_elements_per_block(); e++) {
        element tmp(get_element(mid_x, y, e));
        switch (get_element_type(e)) {
          case cColorDXT1:
            reinterpret_cast<dxt1_block*>(&tmp)->flip_x(w, 4);
            break;
          case cAlphaDXT3:
            reinterpret_cast<dxt3_block*>(&tmp)->flip_x(w, 4);
            break;
          case cAlphaDXT5:
            reinterpret_cast<dxt5_block*>(&tmp)->flip_x(w, 4);
            break;
          default:
            CRNLIB_ASSERT(0);
            break;
        }
        get_element(mid_x, y, e) = tmp;
      }
    }
  }

  return true;
}